

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

size_t charmap_ConvertNext(char **input,uint8_t **output)

{
  Charmap *pCVar1;
  uint8_t uVar2;
  Charmap *pCVar3;
  int iVar4;
  Charmap *pCVar5;
  size_t sVar6;
  char *pcVar7;
  char *fmt;
  char cVar8;
  WarningID id;
  long lVar9;
  uint8_t *puVar10;
  Charmap *pCVar11;
  long lVar12;
  
  pCVar3 = *currentCharmap;
  pcVar7 = *input;
  cVar8 = *pcVar7;
  if (cVar8 != '\0') {
    pCVar1 = pCVar3 + 1;
    pcVar7 = pcVar7 + 1;
    pCVar5 = (Charmap *)0x0;
    lVar12 = 0;
    pCVar11 = pCVar1;
    do {
      sVar6 = (&pCVar11->usedNodes)[(byte)(cVar8 - 1)];
      if (sVar6 == 0) break;
      *input = pcVar7;
      lVar12 = lVar12 + 1;
      lVar9 = sVar6 * 0x800;
      pCVar11 = (Charmap *)((long)pCVar1 + lVar9);
      if (*(char *)((long)pCVar1 + lVar9) != '\0') {
        pCVar5 = pCVar11;
        lVar12 = 0;
      }
      cVar8 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar8 != '\0');
    pcVar7 = pcVar7 + (-1 - lVar12);
    *input = pcVar7;
    if (pCVar5 != (Charmap *)0x0) {
      if (output == (uint8_t **)0x0) {
        return 1;
      }
      uVar2 = *(uint8_t *)((long)&pCVar5->name + 1);
      puVar10 = *output;
      *output = puVar10 + 1;
      *puVar10 = uVar2;
      return 1;
    }
  }
  cVar8 = *pcVar7;
  if (cVar8 == '\0') {
    sVar6 = 0;
  }
  else {
    if (output == (uint8_t **)0x0) {
      puVar10 = (uint8_t *)0x0;
    }
    else {
      puVar10 = *output;
    }
    sVar6 = readUTF8Char(puVar10,pcVar7);
    if (sVar6 == 0) {
      error("Input string is not valid UTF-8\n");
    }
    *input = *input + sVar6;
    if (output != (uint8_t **)0x0) {
      *output = *output + sVar6;
    }
    if (pCVar3->usedNodes < 2) {
      iVar4 = strcmp(pCVar3->name,"main");
      if (iVar4 == 0) {
        return sVar6;
      }
      pcVar7 = printChar((int)cVar8);
      fmt = "Unmapped character %s not in main charmap\n";
      id = WARNING_UNMAPPED_CHAR_2;
    }
    else {
      pcVar7 = printChar((int)cVar8);
      fmt = "Unmapped character %s\n";
      id = WARNING_UNMAPPED_CHAR_1;
    }
    warning(id,fmt,pcVar7);
  }
  return sVar6;
}

Assistant:

size_t charmap_ConvertNext(char const **input, uint8_t **output)
{
	// The goal is to match the longest mapping possible.
	// For that, advance through the trie with each character read.
	// If that would lead to a dead end, rewind characters until the last match, and output.
	// If no match, read a UTF-8 codepoint and output that.
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];
	struct Charnode const *match = NULL;
	size_t rewindDistance = 0;

	for (;;) {
		uint8_t c = **input - 1;

		if (**input && node->next[c]) {
			// Consume that char
			(*input)++;
			rewindDistance++;

			// Advance to next node (index starts at 1)
			node = &charmap->nodes[node->next[c]];
			if (node->isTerminal) {
				// This node matches, register it
				match = node;
				rewindDistance = 0; // If no longer match is found, rewind here
			}

		} else {
			// We are at a dead end (either because we reached the end of input, or of
			// the trie), so rewind up to the last match, and output.
			*input -= rewindDistance; // This will rewind all the way if no match found

			if (match) { // A match was found, use it
				if (output)
					*(*output)++ = match->value;

				return 1;

			} else if (**input) { // No match found, but there is some input left
				int firstChar = **input;
				// This will write the codepoint's value to `output`, little-endian
				size_t codepointLen = readUTF8Char(output ? *output : NULL,
								   *input);

				if (codepointLen == 0)
					error("Input string is not valid UTF-8\n");

				// OK because UTF-8 has no NUL in multi-byte chars
				*input += codepointLen;
				if (output)
					*output += codepointLen;

				// Warn if this character is not mapped but any others are
				if (charmap->usedNodes > 1)
					warning(WARNING_UNMAPPED_CHAR_1,
						"Unmapped character %s\n", printChar(firstChar));
				else if (strcmp(charmap->name, DEFAULT_CHARMAP_NAME))
					warning(WARNING_UNMAPPED_CHAR_2,
						"Unmapped character %s not in " DEFAULT_CHARMAP_NAME
						" charmap\n", printChar(firstChar));

				return codepointLen;

			} else { // End of input
				return 0;
			}
		}
	}
}